

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O1

void __thiscall RtAudio::openRtApi(RtAudio *this,Api api)

{
  RtApiAlsa *this_00;
  RtApi *this_01;
  
  if (this->rtapi_ != (RtApi *)0x0) {
    (*this->rtapi_->_vptr_RtApi[1])();
  }
  this->rtapi_ = (RtApi *)0x0;
  if (api == LINUX_PULSE) {
    this_01 = (RtApi *)operator_new(0x3a0);
    memset(this_01,0,0x3a0);
    RtApi::RtApi(this_01);
    this_01->_vptr_RtApi = (_func_int **)&PTR__RtApiPulse_0011aca8;
    this_01[1]._vptr_RtApi = (_func_int **)0x0;
    *(undefined8 *)&this_01[1].errorStream_ = 0;
    *(undefined8 *)&this_01[1].field_0x10 = 0;
    this->rtapi_ = this_01;
  }
  else if (api == LINUX_ALSA) {
    this_00 = (RtApiAlsa *)operator_new(0x3a0);
    RtApiAlsa::RtApiAlsa(this_00);
    this->rtapi_ = (RtApi *)this_00;
  }
  return;
}

Assistant:

void RtAudio :: openRtApi( RtAudio::Api api )
{
  if ( rtapi_ )
    delete rtapi_;
  rtapi_ = 0;

#if defined(__UNIX_JACK__)
  if ( api == UNIX_JACK )
    rtapi_ = new RtApiJack();
#endif
#if defined(__LINUX_ALSA__)
  if ( api == LINUX_ALSA )
    rtapi_ = new RtApiAlsa();
#endif
#if defined(__LINUX_PULSE__)
  if ( api == LINUX_PULSE )
    rtapi_ = new RtApiPulse();
#endif
#if defined(__LINUX_OSS__)
  if ( api == LINUX_OSS )
    rtapi_ = new RtApiOss();
#endif
#if defined(__WINDOWS_ASIO__)
  if ( api == WINDOWS_ASIO )
    rtapi_ = new RtApiAsio();
#endif
#if defined(__WINDOWS_WASAPI__)
  if ( api == WINDOWS_WASAPI )
    rtapi_ = new RtApiWasapi();
#endif
#if defined(__WINDOWS_DS__)
  if ( api == WINDOWS_DS )
    rtapi_ = new RtApiDs();
#endif
#if defined(__MACOSX_CORE__)
  if ( api == MACOSX_CORE )
    rtapi_ = new RtApiCore();
#endif
#if defined(__RTAUDIO_DUMMY__)
  if ( api == RTAUDIO_DUMMY )
    rtapi_ = new RtApiDummy();
#endif
}